

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasRoberts_FSA_dns.c
# Opt level: O3

int resS(int Ns,sunrealtype t,N_Vector yy,N_Vector yp,N_Vector resval,N_Vector *yyS,N_Vector *ypS,
        N_Vector *resvalS,void *user_data,N_Vector tmp1,N_Vector tmp2,N_Vector tmp3)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double *pdVar5;
  double *pdVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  long lVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  dVar1 = *(double *)((long)user_data + 0x10);
  pdVar5 = *(double **)((long)yy->content + 0x10);
  dVar7 = pdVar5[1];
  dVar8 = pdVar5[2];
  dVar13 = dVar8 * *(double *)((long)user_data + 8);
  dVar12 = *(double *)((long)user_data + 8) * dVar7;
  dVar2 = *user_data;
  dVar3 = *pdVar5;
  lVar11 = 0;
  do {
    pdVar5 = *(double **)((long)yyS[lVar11]->content + 0x10);
    dVar4 = *pdVar5;
    pdVar6 = *(double **)((long)ypS[lVar11]->content + 0x10);
    dVar9 = pdVar5[1];
    dVar10 = pdVar5[2];
    dVar14 = -dVar13 * dVar9 + dVar2 * dVar4 + *pdVar6 + dVar10 * -dVar12;
    dVar15 = dVar12 * dVar10 + dVar13 * dVar9 + -dVar2 * dVar4 + pdVar6[1] +
             dVar9 * (dVar1 + dVar1) * dVar7;
    if ((int)lVar11 == 2) {
      dVar15 = dVar7 * dVar7 + dVar15;
    }
    else if ((int)lVar11 == 1) {
      dVar14 = dVar14 + -dVar7 * dVar8;
      dVar15 = dVar15 + dVar8 * dVar7;
    }
    else {
      dVar14 = dVar14 + dVar3;
      dVar15 = dVar15 - dVar3;
    }
    pdVar5 = *(double **)((long)resvalS[lVar11]->content + 0x10);
    *pdVar5 = dVar14;
    pdVar5[1] = dVar15;
    pdVar5[2] = dVar10 + dVar4 + dVar9;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 3);
  return 0;
}

Assistant:

static int resS(int Ns, sunrealtype t, N_Vector yy, N_Vector yp,
                N_Vector resval, N_Vector* yyS, N_Vector* ypS, N_Vector* resvalS,
                void* user_data, N_Vector tmp1, N_Vector tmp2, N_Vector tmp3)
{
  UserData data;
  sunrealtype p1, p2, p3;
  sunrealtype y1, y2, y3;
  sunrealtype s1, s2, s3;
  sunrealtype sd1, sd2;
  sunrealtype rs1, rs2, rs3;
  int is;

  data = (UserData)user_data;
  p1   = data->p[0];
  p2   = data->p[1];
  p3   = data->p[2];

  y1 = Ith(yy, 1);
  y2 = Ith(yy, 2);
  y3 = Ith(yy, 3);

  for (is = 0; is < NS; is++)
  {
    s1 = Ith(yyS[is], 1);
    s2 = Ith(yyS[is], 2);
    s3 = Ith(yyS[is], 3);

    sd1 = Ith(ypS[is], 1);
    sd2 = Ith(ypS[is], 2);

    rs1 = sd1 + p1 * s1 - p2 * y3 * s2 - p2 * y2 * s3;
    rs2 = sd2 - p1 * s1 + p2 * y3 * s2 + p2 * y2 * s3 + 2 * p3 * y2 * s2;
    rs3 = s1 + s2 + s3;

    switch (is)
    {
    case 0:
      rs1 += y1;
      rs2 -= y1;
      break;
    case 1:
      rs1 -= y2 * y3;
      rs2 += y2 * y3;
      break;
    case 2: rs2 += y2 * y2; break;
    }

    Ith(resvalS[is], 1) = rs1;
    Ith(resvalS[is], 2) = rs2;
    Ith(resvalS[is], 3) = rs3;
  }

  return (0);
}